

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void Diligent::MultiDrawArrays
               (GLenum GlTopology,GLsizei DrawCount,GLsizei *NumVertices,GLint *StartVertexLocation,
               GLsizei NumInstances,GLuint FirstInstanceLocation)

{
  Char *pCVar1;
  undefined1 local_78 [8];
  string msg_1;
  GLenum err;
  undefined1 local_48 [8];
  string msg;
  GLuint FirstInstanceLocation_local;
  GLsizei NumInstances_local;
  GLint *StartVertexLocation_local;
  GLsizei *NumVertices_local;
  GLsizei DrawCount_local;
  GLenum GlTopology_local;
  
  msg.field_2._8_4_ = FirstInstanceLocation;
  msg.field_2._12_4_ = NumInstances;
  if ((NumInstances < 2) && (FirstInstanceLocation == 0)) {
    (*__glewMultiDrawArrays)(GlTopology,StartVertexLocation,NumVertices,DrawCount);
  }
  else {
    FormatString<char[58]>
              ((string *)local_48,
               (char (*) [58])"Instanced multi-draw is not currently supported in OpenGL");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"MultiDrawArrays",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x38c);
    std::__cxx11::string::~string((string *)local_48);
  }
  msg_1.field_2._8_4_ = glGetError();
  if (msg_1.field_2._8_4_ != 0) {
    LogError<false,char[23],char[17],unsigned_int>
              (false,"MultiDrawArrays",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x393,(char (*) [23])"MultiDrawArrays failed",(char (*) [17])"\nGL Error Code: ",
               (uint *)(msg_1.field_2._M_local_buf + 8));
    FormatString<char[6]>((string *)local_78,(char (*) [6])0x4585f6);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"MultiDrawArrays",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x393);
    std::__cxx11::string::~string((string *)local_78);
  }
  return;
}

Assistant:

inline void MultiDrawArrays(GLenum         GlTopology,
                            GLsizei        DrawCount,
                            const GLsizei* NumVertices,
                            const GLint*   StartVertexLocation,
                            GLsizei        NumInstances,
                            GLuint         FirstInstanceLocation)
{
    if (NumInstances > 1 || FirstInstanceLocation != 0)
    {
        UNSUPPORTED("Instanced multi-draw is not currently supported in OpenGL");
    }
    else
    {
        glMultiDrawArrays(GlTopology, StartVertexLocation, NumVertices, DrawCount);
    }

    DEV_CHECK_GL_ERROR("MultiDrawArrays failed");
}